

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_keywrap.c
# Opt level: O0

int keyUnwrapCryptoPro(gost_ctx *ctx,uchar *keyExchangeKey,uchar *wrappedKey,uchar *sessionKey)

{
  uchar *in_RCX;
  gost_ctx *in_RDX;
  uchar cek_mac [4];
  uchar kek_ukm [32];
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  u4 in_stack_ffffffffffffffb4;
  uchar *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  uchar *in_stack_ffffffffffffffc8;
  uchar *in_stack_ffffffffffffffd0;
  int mac_len;
  uint local_4;
  
  keyDiversifyCryptoPro(in_RDX,in_RCX,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  mac_len = (int)((ulong)in_RCX >> 0x20);
  gost_key((gost_ctx *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
           (byte *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  gost_dec((gost_ctx *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
           in_stack_ffffffffffffffb8,
           (byte *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
           in_stack_ffffffffffffffac);
  gost_mac_iv(in_RDX,mac_len,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
              in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb8);
  local_4 = (uint)(in_stack_ffffffffffffffb4 == in_RDX->key[2]);
  return local_4;
}

Assistant:

int keyUnwrapCryptoPro(gost_ctx * ctx, const unsigned char *keyExchangeKey,
                       const unsigned char *wrappedKey,
                       unsigned char *sessionKey)
{
    unsigned char kek_ukm[32], cek_mac[4];
    keyDiversifyCryptoPro(ctx, keyExchangeKey, wrappedKey
                          /* First 8 bytes of wrapped Key is ukm */
                          , kek_ukm);
    gost_key(ctx, kek_ukm);
    gost_dec(ctx, wrappedKey + 8, sessionKey, 4);
    gost_mac_iv(ctx, 32, wrappedKey, sessionKey, 32, cek_mac);
    if (memcmp(cek_mac, wrappedKey + 40, 4)) {
        return 0;
    }
    return 1;
}